

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVIntHelpers.h
# Opt level: O0

bool slang::isSignExtended
               (uint64_t *input,uint32_t numWords,uint32_t word,uint32_t bit,uint64_t topWordMask)

{
  byte bVar1;
  bool bVar2;
  uint32_t i;
  uint64_t mask;
  bool sign;
  uint64_t topWordMask_local;
  uint32_t bit_local;
  uint32_t word_local;
  uint32_t numWords_local;
  uint64_t *input_local;
  
  bVar1 = (byte)bit;
  bVar2 = (input[word] & 1L << (bVar1 & 0x3f)) != 0;
  topWordMask_local = topWordMask;
  numWords_local = numWords;
  if ((bVar2) && (word < numWords - 1)) {
    if (input[numWords - 1] != topWordMask) {
      return false;
    }
    numWords_local = numWords - 1;
    topWordMask_local = 0xffffffffffffffff;
  }
  mask = 0;
  i = numWords_local;
  if (bVar2) {
    mask = 0xffffffffffffffff;
  }
  do {
    i = i - 1;
    if (i <= word) {
      if (numWords_local - 1 == word) {
        mask = topWordMask_local & mask;
      }
      return input[word] >> (bVar1 & 0x3f) == mask >> (bVar1 & 0x3f);
    }
  } while (input[i] == mask);
  return false;
}

Assistant:

static bool isSignExtended(const uint64_t* input, uint32_t numWords, uint32_t word, uint32_t bit,
                           uint64_t topWordMask) {
    bool sign = (input[word] & (1ULL << bit)) != 0;
    if (sign && numWords - 1 > word) {
        if (input[numWords - 1] != topWordMask)
            return false;
        numWords--;
        topWordMask = UINT64_MAX;
    }

    uint64_t mask = sign ? UINT64_MAX : 0;
    for (auto i = numWords - 1; i > word; i--) {
        if (input[i] != mask)
            return false;
    }

    if (numWords - 1 == word)
        mask &= topWordMask;
    mask >>= bit;
    return (input[word] >> bit) == mask;
}